

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  uint uVar1;
  int type;
  connectdata *conn;
  size_t sVar2;
  CURLcode CVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  dynbuf *pdVar8;
  uint uVar9;
  dynbuf *pdVar10;
  tempbuf writebuf [3];
  Curl_easy *local_b0;
  dynbuf local_a8;
  int local_88 [22];
  
  CVar3 = CURLE_BAD_FUNCTION_ARGUMENT;
  if (((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) &&
     (data->conn != (connectdata *)0x0)) {
    uVar1 = (data->req).keepon;
    uVar9 = ((action & 1U) << 4 | uVar1 & 0xffffffcf) + (action & 4U) * 8;
    CVar3 = CURLE_OK;
    if ((uVar9 & 0x30) != (uVar1 & 0x30)) {
      if ((((uVar1 & ~uVar9 & 0x20) != 0) &&
          ((data->mstate & ~CURLM_STATE_CONNECT_PEND) == CURLM_STATE_PERFORM)) &&
         ((data->state).fread_func == Curl_mime_read)) {
        Curl_mime_unpause((curl_mimepart *)(data->state).in);
      }
      (data->req).keepon = uVar9;
      CVar3 = CURLE_OK;
      if (((action & 1U) == 0) && (uVar1 = (data->state).tempcount, uVar1 != 0)) {
        conn = data->conn;
        if ((data->state).tempcount != 0) {
          pdVar8 = &(data->state).tempwrite[0].b;
          pdVar10 = &local_a8;
          uVar6 = 0;
          do {
            pdVar10[1].bufr = pdVar8[1].bufr;
            pcVar4 = pdVar8->bufr;
            sVar5 = pdVar8->leng;
            sVar2 = pdVar8->toobig;
            pdVar10->allc = pdVar8->allc;
            pdVar10->toobig = sVar2;
            pdVar10->bufr = pcVar4;
            pdVar10->leng = sVar5;
            Curl_dyn_init(pdVar8,0x4000000);
            uVar6 = uVar6 + 1;
            pdVar10 = (dynbuf *)&pdVar10[1].leng;
            pdVar8 = (dynbuf *)&pdVar8[1].leng;
          } while (uVar6 < (data->state).tempcount);
        }
        (data->state).tempcount = 0;
        local_b0 = conn->data;
        CVar3 = CURLE_OK;
        if (local_b0 == data) {
          local_b0 = (Curl_easy *)0x0;
        }
        else {
          conn->data = data;
        }
        lVar7 = 0;
        do {
          pdVar8 = (dynbuf *)((long)&local_a8.bufr + lVar7);
          if (CVar3 == CURLE_OK) {
            type = *(int *)((long)local_88 + lVar7);
            pcVar4 = Curl_dyn_ptr(pdVar8);
            sVar5 = Curl_dyn_len(pdVar8);
            CVar3 = Curl_client_write(conn,type,pcVar4,sVar5);
          }
          Curl_dyn_free(pdVar8);
          lVar7 = lVar7 + 0x28;
        } while ((ulong)(uVar1 + (uVar1 == 0)) * 0x28 != lVar7);
        if (local_b0 != (Curl_easy *)0x0) {
          conn->data = local_b0;
        }
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
      }
      if ((uVar9 & 0x30) != 0x30) {
        Curl_expire(data,0,EXPIRE_RUN_NOW);
        if ((data->state).tempcount == 0) {
          data->conn->cselect_bits = 3;
        }
        if (data->multi != (Curl_multi *)0x0) {
          Curl_update_timer(data->multi);
        }
      }
      if (((data->state).field_0x601 & 0x10) == 0) {
        Curl_updatesocket(data);
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k;
  CURLcode result = CURLE_OK;
  int oldstate;
  int newstate;

  if(!GOOD_EASY_HANDLE(data) || !data->conn)
    /* crazy input, don't continue */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  k = &data->req;
  oldstate = k->keepon & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* first switch off both pause bits then set the new pause bits */
  newstate = (k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) |
    ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  if((newstate & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) == oldstate) {
    /* Not changing any pause state, return */
    DEBUGF(infof(data, "pause: no change, early return\n"));
    return CURLE_OK;
  }

  /* Unpause parts in active mime tree. */
  if((k->keepon & ~newstate & KEEP_SEND_PAUSE) &&
     (data->mstate == CURLM_STATE_PERFORM ||
      data->mstate == CURLM_STATE_TOOFAST) &&
     data->state.fread_func == (curl_read_callback) Curl_mime_read) {
    Curl_mime_unpause(data->state.in);
  }

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE)) {
    Curl_http2_stream_pause(data, FALSE);

    if(data->state.tempcount) {
      /* there are buffers for sending that can be delivered as the receive
         pausing is lifted! */
      unsigned int i;
      unsigned int count = data->state.tempcount;
      struct tempbuf writebuf[3]; /* there can only be three */
      struct connectdata *conn = data->conn;
      struct Curl_easy *saved_data = NULL;

      /* copy the structs to allow for immediate re-pausing */
      for(i = 0; i < data->state.tempcount; i++) {
        writebuf[i] = data->state.tempwrite[i];
        Curl_dyn_init(&data->state.tempwrite[i].b, DYN_PAUSE_BUFFER);
      }
      data->state.tempcount = 0;

      /* set the connection's current owner */
      if(conn->data != data) {
        saved_data = conn->data;
        conn->data = data;
      }

      for(i = 0; i < count; i++) {
        /* even if one function returns error, this loops through and frees
           all buffers */
        if(!result)
          result = Curl_client_write(conn, writebuf[i].type,
                                     Curl_dyn_ptr(&writebuf[i].b),
                                     Curl_dyn_len(&writebuf[i].b));
        Curl_dyn_free(&writebuf[i].b);
      }

      /* recover previous owner of the connection */
      if(saved_data)
        conn->data = saved_data;

      if(result)
        return result;
    }
  }

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if((newstate & (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
     (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) {
    Curl_expire(data, 0, EXPIRE_RUN_NOW); /* get this handle going again */

    if(!data->state.tempcount)
      /* if not pausing again, force a recv/send check of this connection as
         the data might've been read off the socket already */
      data->conn->cselect_bits = CURL_CSELECT_IN | CURL_CSELECT_OUT;
    if(data->multi)
      Curl_update_timer(data->multi);
  }

  if(!data->state.done)
    /* This transfer may have been moved in or out of the bundle, update the
       corresponding socket callback, if used */
    Curl_updatesocket(data);

  return result;
}